

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::core::string<unsigned_long>_>::push_back
          (array<irr::core::string<unsigned_long>_> *this,string<unsigned_long> *element)

{
  uint uVar1;
  undefined1 local_28 [8];
  string<unsigned_long> e;
  string<unsigned_long> *element_local;
  array<irr::core::string<unsigned_long>_> *this_local;
  
  e._8_8_ = element;
  if (this->allocated < this->used + 1) {
    string<unsigned_long>::string((string<unsigned_long> *)local_28);
    string<unsigned_long>::operator=
              ((string<unsigned_long> *)local_28,(string<unsigned_long> *)e._8_8_);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    string<unsigned_long>::operator=(this->data + uVar1,(string<unsigned_long> *)local_28);
    this->is_sorted = false;
    string<unsigned_long>::~string((string<unsigned_long> *)local_28);
  }
  else {
    uVar1 = this->used;
    this->used = uVar1 + 1;
    string<unsigned_long>::operator=(this->data + uVar1,element);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}